

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

bool anon_unknown.dwarf_59d9::error(err_t error_num,path *p,error_code *ec,char *message)

{
  error_category *peVar1;
  filesystem_error *this;
  error_code ec_00;
  allocator<char> local_41;
  string local_40;
  
  ec_00._4_4_ = 0;
  ec_00.m_val = error_num;
  if (error_num == 0) {
    if (ec == (error_code *)0x0) goto LAB_0010c547;
    ec->m_val = 0;
    peVar1 = boost::system::system_category();
  }
  else {
    if (ec == (error_code *)0x0) {
      this = (filesystem_error *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,message,&local_41);
      peVar1 = boost::system::system_category();
      ec_00.m_cat = peVar1;
      boost::filesystem::filesystem_error::filesystem_error(this,&local_40,p,ec_00);
      __cxa_throw(this,&boost::filesystem::filesystem_error::typeinfo,
                  boost::filesystem::filesystem_error::~filesystem_error);
    }
    peVar1 = boost::system::system_category();
    ec->m_val = error_num;
  }
  ec->m_cat = peVar1;
LAB_0010c547:
  return error_num != 0;
}

Assistant:

bool error(err_t error_num, const path& p, error_code* ec, const char* message)
  {
    if (!error_num)
    {
      if (ec != 0) ec->clear();
    }
    else  
    { //  error
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(message,
          p, error_code(error_num, system_category())));
      else
        ec->assign(error_num, system_category());
    }
    return error_num != 0;
  }